

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O1

bool __thiscall Opcode::AABBQuantizedTree::Build(AABBQuantizedTree *this,AABBTree *tree)

{
  AABBCollisionNode *linear;
  sword *psVar1;
  AABBQuantizedNode *pAVar2;
  AABBQuantizedNode *pAVar3;
  ulong *puVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  AABBQuantizedNode *pAVar9;
  udword j;
  uword *puVar10;
  uword uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Point Min;
  Point Max;
  udword CurID;
  float local_4c [6];
  udword local_34;
  
  if (tree == (AABBTree *)0x0) {
    return false;
  }
  bVar12 = tree->mTotalNbNodes == (tree->super_AABBTreeNode).mNbPrimitives * 2 - 1;
  if (bVar12) {
    (this->super_AABBOptimizedTree).mNbNodes = tree->mTotalNbNodes;
    pAVar2 = this->mNodes;
    if (pAVar2 != (AABBQuantizedNode *)0x0) {
      operator_delete__(&pAVar2[-1].mData,pAVar2[-1].mData * 0x18 + 8);
      this->mNodes = (AABBQuantizedNode *)0x0;
    }
    uVar8 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar4 = (ulong *)operator_new__(uVar8 * 0x20 + 8);
    linear = (AABBCollisionNode *)(puVar4 + 1);
    *puVar4 = uVar8;
    if (uVar8 != 0) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)puVar4 + lVar5 + 0x20) = 0;
        lVar5 = lVar5 + 0x20;
      } while (uVar8 * 0x20 != lVar5);
    }
    local_34 = 1;
    _BuildCollisionTree(linear,0,&local_34,&tree->super_AABBTreeNode);
    uVar8 = (ulong)(this->super_AABBOptimizedTree).mNbNodes;
    puVar6 = (ulong *)operator_new__(uVar8 * 0x18 + 8);
    pAVar2 = (AABBQuantizedNode *)(puVar6 + 1);
    *puVar6 = uVar8;
    if (uVar8 != 0) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)puVar6 + lVar5 + 0x18) = 0;
        lVar5 = lVar5 + 0x18;
      } while (uVar8 * 0x18 != lVar5);
    }
    this->mNodes = pAVar2;
    if (uVar8 == 0) {
      fVar13 = -3.4028235e+38;
      fVar17 = -3.4028235e+38;
      fVar18 = -3.4028235e+38;
      fVar14 = -3.4028235e+38;
      fVar15 = -3.4028235e+38;
      fVar16 = -3.4028235e+38;
    }
    else {
      lVar5 = 0;
      fVar20 = -3.4028235e+38;
      fVar21 = -3.4028235e+38;
      fVar19 = -3.4028235e+38;
      fVar22 = -3.4028235e+38;
      fVar23 = -3.4028235e+38;
      fVar24 = -3.4028235e+38;
      do {
        fVar14 = ABS(*(float *)((long)puVar4 + lVar5 + 8));
        if (fVar14 <= fVar24) {
          fVar14 = fVar24;
        }
        fVar15 = ABS(*(float *)((long)puVar4 + lVar5 + 0xc));
        if (fVar15 <= fVar22) {
          fVar15 = fVar22;
        }
        fVar16 = ABS(*(float *)((long)puVar4 + lVar5 + 0x10));
        if (fVar16 <= fVar21) {
          fVar16 = fVar21;
        }
        fVar13 = ABS(*(float *)((long)puVar4 + lVar5 + 0x14));
        if (fVar13 <= fVar23) {
          fVar13 = fVar23;
        }
        fVar17 = ABS(*(float *)((long)puVar4 + lVar5 + 0x18));
        if (fVar17 <= fVar19) {
          fVar17 = fVar19;
        }
        fVar18 = ABS(*(float *)((long)puVar4 + lVar5 + 0x1c));
        if (fVar18 <= fVar20) {
          fVar18 = fVar20;
        }
        lVar5 = lVar5 + 0x20;
        fVar20 = fVar18;
        fVar21 = fVar16;
        fVar19 = fVar17;
        fVar22 = fVar15;
        fVar23 = fVar13;
        fVar24 = fVar14;
      } while (uVar8 << 5 != lVar5);
    }
    fVar14 = (float)(-(uint)(fVar14 != 0.0) & (uint)(32767.0 / fVar14));
    fVar15 = (float)(-(uint)(fVar15 != 0.0) & (uint)(32767.0 / fVar15));
    fVar16 = (float)(-(uint)(fVar16 != 0.0) & (uint)(32767.0 / fVar16));
    fVar13 = (float)(-(uint)(fVar13 != 0.0) & (uint)(32767.0 / fVar13));
    fVar17 = (float)(-(uint)(fVar17 != 0.0) & (uint)(32767.0 / fVar17));
    fVar18 = (float)(-(uint)(fVar18 != 0.0) & (uint)(32767.0 / fVar18));
    (this->mCenterCoeff).x = (float)(-(uint)(fVar14 != 0.0) & (uint)(1.0 / fVar14));
    (this->mCenterCoeff).y = (float)(-(uint)(fVar15 != 0.0) & (uint)(1.0 / fVar15));
    (this->mCenterCoeff).z = (float)(-(uint)(fVar16 != 0.0) & (uint)(1.0 / fVar16));
    (this->mExtentsCoeff).x = (float)(-(uint)(fVar13 != 0.0) & (uint)(1.0 / fVar13));
    (this->mExtentsCoeff).y = (float)(-(uint)(fVar17 != 0.0) & (uint)(1.0 / fVar17));
    (this->mExtentsCoeff).z = (float)(-(uint)(fVar18 != 0.0) & (uint)(1.0 / fVar18));
    if (uVar8 != 0) {
      uVar7 = 0;
      do {
        lVar5 = uVar7 * 0x20;
        fVar20 = linear[uVar7].mAABB.mCenter.x;
        pAVar3 = pAVar2 + uVar7;
        (pAVar3->mAABB).mCenter[0] = (sword)(int)(fVar14 * fVar20);
        fVar21 = *(float *)((long)puVar4 + lVar5 + 0xc);
        (pAVar3->mAABB).mCenter[1] = (sword)(int)(fVar15 * fVar21);
        fVar19 = *(float *)(puVar4 + uVar7 * 4 + 2);
        (pAVar3->mAABB).mCenter[2] = (sword)(int)(fVar16 * fVar19);
        fVar22 = *(float *)((long)puVar4 + lVar5 + 0x14);
        (pAVar3->mAABB).mExtents[0] = (uword)(int)(fVar13 * fVar22);
        (pAVar3->mAABB).mExtents[1] = (uword)(int)(*(float *)(puVar4 + uVar7 * 4 + 3) * fVar17);
        (pAVar3->mAABB).mExtents[2] = (uword)(int)(*(float *)((long)puVar4 + lVar5 + 0x1c) * fVar18)
        ;
        fVar23 = *(float *)((long)puVar4 + lVar5 + 0x1c);
        local_4c[3] = fVar20 + fVar22;
        local_4c[4] = fVar21 + *(float *)(puVar4 + uVar7 * 4 + 3);
        local_4c[5] = fVar19 + fVar23;
        local_4c[0] = fVar20 - fVar22;
        local_4c[1] = fVar21 - *(float *)(puVar4 + uVar7 * 4 + 3);
        local_4c[2] = fVar19 - fVar23;
        lVar5 = 0;
        do {
          psVar1 = (pAVar3->mAABB).mCenter + lVar5;
          puVar10 = (uword *)(psVar1 + 3);
          fVar19 = (float)(int)*psVar1 * (&(this->mCenterCoeff).x)[lVar5];
          fVar20 = (&(this->mExtentsCoeff).x)[lVar5];
          fVar21 = local_4c[lVar5 + 3];
          uVar11 = *puVar10;
          bVar12 = true;
          do {
            fVar22 = (float)uVar11 * fVar20;
            if ((fVar19 + fVar22 < fVar21) ||
               (fVar22 = fVar19 - fVar22, local_4c[lVar5] <= fVar22 && fVar22 != local_4c[lVar5])) {
              uVar11 = uVar11 + 1;
              *puVar10 = uVar11;
            }
            else {
              bVar12 = false;
            }
            if (uVar11 == 0) {
              *puVar10 = 0xffff;
              uVar11 = 0xffff;
              bVar12 = false;
            }
          } while (bVar12);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        pAVar3 = (AABBQuantizedNode *)linear[uVar7].mData;
        pAVar9 = pAVar2 + ((uint)((int)pAVar3 - (int)linear) >> 5);
        if (((ulong)pAVar3 & 1) != 0) {
          pAVar9 = pAVar3;
        }
        puVar6[uVar7 * 3 + 3] = (ulong)pAVar9;
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar8);
    }
    operator_delete__(puVar4,*puVar4 << 5 | 8);
    bVar12 = true;
  }
  return bVar12;
}

Assistant:

bool AABBQuantizedTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbNodes;
	DELETEARRAY(mNodes);
	AABBCollisionNode* Nodes = new AABBCollisionNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildCollisionTree(Nodes, 0, CurID, tree);

	// Quantize
	{
		mNodes = new AABBQuantizedNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}